

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManReportImprovement(Gia_Man_t *p,Gia_Man_t *pNew)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  
  iVar3 = p->nRegs;
  dVar4 = 0.0;
  if (iVar3 != 0) {
    dVar4 = ((double)(iVar3 - pNew->nRegs) * 100.0) / (double)iVar3;
  }
  Abc_Print((int)p,"REG: Beg = %5d. End = %5d. (R =%5.1f %%)  ",dVar4);
  uVar1 = Gia_ManAndNum(p);
  uVar2 = Gia_ManAndNum(pNew);
  iVar3 = (int)pNew;
  dVar4 = 0.0;
  if (uVar1 != 0) {
    dVar4 = ((double)(int)(uVar1 - uVar2) * 100.0) / (double)(int)uVar1;
  }
  Abc_Print(iVar3,"AND: Beg = %6d. End = %6d. (R =%5.1f %%)",dVar4,(ulong)uVar1,(ulong)uVar2);
  Abc_Print(iVar3,"\n");
  return;
}

Assistant:

void Gia_ManReportImprovement( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Abc_Print( 1, "REG: Beg = %5d. End = %5d. (R =%5.1f %%)  ",
        Gia_ManRegNum(p), Gia_ManRegNum(pNew),
        Gia_ManRegNum(p)? 100.0*(Gia_ManRegNum(p)-Gia_ManRegNum(pNew))/Gia_ManRegNum(p) : 0.0 );
    Abc_Print( 1, "AND: Beg = %6d. End = %6d. (R =%5.1f %%)",
        Gia_ManAndNum(p), Gia_ManAndNum(pNew),
        Gia_ManAndNum(p)? 100.0*(Gia_ManAndNum(p)-Gia_ManAndNum(pNew))/Gia_ManAndNum(p) : 0.0 );
    Abc_Print( 1, "\n" );
}